

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::handle_store_to_invariant_variable
          (CompilerGLSL *this,uint32_t store_id,uint32_t value_id)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRExpression *expr;
  
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)store_id,DecorationInvariant);
  if (((bVar2) &&
      (uVar3 = (ulong)value_id,
      uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)) &&
     (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar3].type == TypeExpression)) {
    expr = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar3);
    disallow_forwarding_in_expression_chain(this,expr);
    return;
  }
  return;
}

Assistant:

void CompilerGLSL::handle_store_to_invariant_variable(uint32_t store_id, uint32_t value_id)
{
	// Variables or access chains marked invariant are complicated. We will need to make sure the code-gen leading up to
	// this variable is consistent. The failure case for SPIRV-Cross is when an expression is forced to a temporary
	// in one translation unit, but not another, e.g. due to multiple use of an expression.
	// This causes variance despite the output variable being marked invariant, so the solution here is to force all dependent
	// expressions to be temporaries.
	// It is uncertain if this is enough to support invariant in all possible cases, but it should be good enough
	// for all reasonable uses of invariant.
	if (!has_decoration(store_id, DecorationInvariant))
		return;

	auto *expr = maybe_get<SPIRExpression>(value_id);
	if (!expr)
		return;

	disallow_forwarding_in_expression_chain(*expr);
}